

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::SharedDtor
          (LayerNormalizationLayerParams *this)

{
  LayerNormalizationLayerParams *pLVar1;
  LayerNormalizationLayerParams *this_local;
  
  pLVar1 = internal_default_instance();
  if ((this != pLVar1) && (this->gamma_ != (WeightParams *)0x0)) {
    (*(this->gamma_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pLVar1 = internal_default_instance();
  if ((this != pLVar1) && (this->beta_ != (WeightParams *)0x0)) {
    (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void LayerNormalizationLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete gamma_;
  }
  if (this != internal_default_instance()) {
    delete beta_;
  }
}